

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_xbm.c
# Opt level: O2

gdImagePtr gdImageCreateFromXbm(FILE *fd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  gdImagePtr im;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  int local_260;
  char h [8];
  uint b;
  int value;
  char fline [255];
  char iname [255];
  
  rewind((FILE *)fd);
  iVar3 = 0;
  iVar10 = 0;
  iVar9 = 0;
  iVar11 = 0;
  do {
    iVar7 = (iVar3 + 7U >> 3) * iVar11;
LAB_0011f13d:
    pcVar4 = fgets(fline,0xff,(FILE *)fd);
    iVar1 = iVar10;
    if (pcVar4 == (char *)0x0) goto LAB_0011f2aa;
    fline[0xfe] = '\0';
    sVar5 = strlen(fline);
    if (sVar5 == 0xfe) {
      return (gdImagePtr)0x0;
    }
    iVar1 = __isoc99_sscanf(fline,"#define %s %d",iname,&value);
    if (iVar1 != 2) {
      iVar2 = __isoc99_sscanf(fline,"static unsigned char %s = {",iname);
      iVar1 = 0x80;
      if ((iVar2 != 1) && (iVar2 = __isoc99_sscanf(fline,"static char %s = {",iname), iVar2 != 1))
      break;
      goto LAB_0011f217;
    }
    pcVar6 = strrchr(iname,0x5f);
    pcVar4 = pcVar6 + 1;
    if (pcVar6 == (char *)0x0) {
      pcVar4 = iname;
    }
    iVar1 = strcmp("width",pcVar4);
    iVar7 = value;
    if (iVar1 == 0) {
      iVar3 = value;
    }
    iVar1 = strcmp("height",pcVar4);
    if (iVar1 == 0) {
      iVar11 = iVar7;
    }
  } while( true );
  iVar2 = __isoc99_sscanf(fline,"static unsigned short %s = {",iname);
  iVar1 = 0x8000;
  if ((iVar2 == 1) ||
     ((iVar2 = __isoc99_sscanf(fline,"static short %s = {",iname), iVar2 == 1 ||
      (bVar12 = iVar10 != 0, iVar1 = iVar10, iVar10 = 0, bVar12)))) {
LAB_0011f217:
    if (iVar7 == 0) {
      return (gdImagePtr)0x0;
    }
    pcVar6 = strrchr(iname,0x5f);
    pcVar4 = pcVar6 + 1;
    if (pcVar6 == (char *)0x0) {
      pcVar4 = iname;
    }
    iVar2 = strcmp("bits[]",pcVar4);
    iVar9 = iVar7;
    iVar10 = iVar1;
    if (iVar2 == 0) {
LAB_0011f2aa:
      if (iVar1 == 0 || iVar9 == 0) {
        return (gdImagePtr)0x0;
      }
      im = gdImageCreate(iVar3,iVar11);
      if (im == (gdImagePtr)0x0) {
        return (gdImagePtr)0x0;
      }
      gdImageColorAllocate(im,0xff,0xff,0xff);
      gdImageColorAllocate(im,0,0,0);
      h[2] = '\0';
      h[4] = '\0';
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      iVar11 = 0;
      iVar10 = 0;
      local_260 = 0;
      goto LAB_0011f323;
    }
  }
  goto LAB_0011f13d;
LAB_0011f323:
  if (iVar11 == iVar9) {
LAB_0011f428:
    gd_error("EOF before image was complete");
    gdImageDestroy(im);
    return (gdImagePtr)0x0;
  }
  do {
    iVar3 = getc((FILE *)fd);
    if (iVar3 == -1) goto LAB_0011f428;
  } while (iVar3 != 0x78);
  iVar3 = getc((FILE *)fd);
  if (iVar3 == -1) goto LAB_0011f428;
  h[0] = (char)iVar3;
  iVar3 = getc((FILE *)fd);
  if (iVar3 == -1) goto LAB_0011f428;
  h[1] = (char)iVar3;
  if (iVar1 == 0x8000) {
    iVar3 = getc((FILE *)fd);
    if (iVar3 == -1) goto LAB_0011f428;
    h[2] = (char)iVar3;
    iVar3 = getc((FILE *)fd);
    if (iVar3 == -1) goto LAB_0011f428;
    h[3] = (char)iVar3;
  }
  __isoc99_sscanf(h,"%x",&b);
  uVar8 = 1;
  do {
    if (iVar1 < (int)uVar8) goto LAB_0011f417;
    iVar3 = iVar10 + 1;
    gdImageSetPixel(im,iVar10,local_260,(uint)((b & uVar8) != 0));
    uVar8 = uVar8 * 2;
    iVar10 = iVar3;
  } while (iVar3 != im->sx);
  local_260 = local_260 + 1;
  iVar10 = 0;
  if (local_260 == im->sy) {
    return im;
  }
LAB_0011f417:
  iVar11 = iVar11 + 1;
  goto LAB_0011f323;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromXbm(FILE * fd)
{
	char fline[MAX_XBM_LINE_SIZE];
	char iname[MAX_XBM_LINE_SIZE];
	char *type;
	int value;
	unsigned int width = 0, height = 0;
	int fail = 0;
	int max_bit = 0;

	gdImagePtr im;
	int bytes = 0, i;
	int bit, x = 0, y = 0;
	int ch;
	char h[8];
	unsigned int b;

	rewind(fd);
	while (fgets(fline, MAX_XBM_LINE_SIZE, fd)) {
		fline[MAX_XBM_LINE_SIZE-1] = '\0';
		if (strlen(fline) == MAX_XBM_LINE_SIZE-1) {
			return 0;
		}
		if (sscanf(fline, "#define %s %d", iname, &value) == 2) {
			if (!(type = strrchr(iname, '_'))) {
				type = iname;
			} else {
				type++;
			}

			if (!strcmp("width", type)) {
				width = (unsigned int) value;
			}
			if (!strcmp("height", type)) {
				height = (unsigned int) value;
			}
		} else {
			if ( sscanf(fline, "static unsigned char %s = {", iname) == 1
			  || sscanf(fline, "static char %s = {", iname) == 1)
			{
				max_bit = 128;
			} else if (sscanf(fline, "static unsigned short %s = {", iname) == 1
					|| sscanf(fline, "static short %s = {", iname) == 1)
			{
				max_bit = 32768;
			}
			if (max_bit) {
                bytes = (width + 7) / 8 * height;
				if (!bytes) {
					return 0;
				}
				if (!(type = strrchr(iname, '_'))) {
					type = iname;
				} else {
					type++;
				}
				if (!strcmp("bits[]", type)) {
					break;
				}
			}
 		}
	}
	if (!bytes || !max_bit) {
		return 0;
	}

	if(!(im = gdImageCreate(width, height))) {
		return 0;
	}
	gdImageColorAllocate(im, 255, 255, 255);
	gdImageColorAllocate(im, 0, 0, 0);
	h[2] = '\0';
	h[4] = '\0';
	for (i = 0; i < bytes; i++) {
		while (1) {
			if ((ch=getc(fd)) == EOF) {
				fail = 1;
				break;
			}
			if (ch == 'x') {
				break;
			}
		}
		if (fail) {
			break;
		}
		/* Get hex value */
		if ((ch=getc(fd)) == EOF) {
			break;
		}
		h[0] = ch;
		if ((ch=getc(fd)) == EOF) {
			break;
		}
		h[1] = ch;
		if (max_bit == 32768) {
			if ((ch=getc(fd)) == EOF) {
				break;
			}
			h[2] = ch;
			if ((ch=getc(fd)) == EOF) {
				break;
			}
			h[3] = ch;
		}
		sscanf(h, "%x", &b);
		for (bit = 1; bit <= max_bit; bit = bit << 1) {
			gdImageSetPixel(im, x++, y, (b & bit) ? 1 : 0);
			if (x == im->sx) {
				x = 0;
				y++;
				if (y == im->sy) {
					return im;
				}
				break;
			}
		}
	}

	gd_error("EOF before image was complete");
	gdImageDestroy(im);
	return 0;
}